

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_struct_reader
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  t_type *ptVar7;
  undefined4 extraout_var_00;
  reference pptVar8;
  string *psVar9;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> *p_Var10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_320
  ;
  string local_318;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_2f8
  ;
  t_field **local_2f0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_2e8
  ;
  t_field **local_2e0;
  string local_2d8;
  string local_2b8;
  string local_298;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_278
  ;
  t_field **local_270;
  string local_268;
  string local_248;
  byte local_221;
  const_iterator cStack_220;
  bool optional_1;
  t_field **local_218;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_210
  ;
  const_iterator f_iter_1;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields_1;
  string local_1f8 [8];
  string visibility_1;
  string local_1d0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1b0
  ;
  t_field **local_1a8;
  string local_1a0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_180
  ;
  t_field **local_178;
  string local_170;
  string local_150;
  t_base local_12c;
  t_base_type *ptStack_128;
  t_base tbase;
  t_type *type;
  string local_118 [8];
  string padding;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_d8;
  t_field **local_d0;
  string local_c8;
  string local_a8;
  byte local_81;
  const_iterator cStack_80;
  bool optional;
  t_field **local_78;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_70;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  allocator local_49;
  string local_48 [8];
  string visibility;
  bool is_private_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  visibility.field_2._M_local_buf[0xf] = is_private;
  if ((this->gen_cocoa_ & 1U) == 0) {
    pcVar5 = "public";
    if (is_private) {
      pcVar5 = "fileprivate";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar5,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,local_48);
    poVar6 = std::operator<<(poVar6," static func read(from proto: TProtocol) throws -> ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar2));
    block_open(this,out);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"_ = try proto.readStructBegin()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_70);
    local_78 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_70._M_current = local_78;
    while( true ) {
      cStack_80 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_70,&stack0xffffffffffffff80);
      if (!bVar1) break;
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      local_81 = field_is_optional(this,*pptVar8);
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"var ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
      maybe_escape_identifier(&local_a8,this,psVar9);
      poVar6 = std::operator<<(poVar6,(string *)&local_a8);
      poVar6 = std::operator<<(poVar6,": ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      ptVar7 = t_field::get_type(*pptVar8);
      type_name_abi_cxx11_(&local_c8,this,ptVar7,(bool)(local_81 & 1),(bool)(~local_81 & 1));
      poVar6 = std::operator<<(poVar6,(string *)&local_c8);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_70);
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar6,"fields: while true");
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"let (_, fieldType, fieldID) = try proto.readFieldBegin()");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar6,"switch (fieldID, fieldType)");
    block_open(this,out);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"case (_, .stop):            break fields");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    local_d0 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_70._M_current = local_d0;
    while( true ) {
      local_d8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_70,&local_d8);
      if (!bVar1) break;
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"case (");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      iVar3 = t_field::get_key(*pptVar8);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6,", ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      ptVar7 = t_field::get_type(*pptVar8);
      type_to_enum_abi_cxx11_((string *)((long)&padding.field_2 + 8),this,ptVar7,false);
      poVar6 = std::operator<<(poVar6,(string *)(padding.field_2._M_local_buf + 8));
      std::operator<<(poVar6,"):");
      std::__cxx11::string::~string((string *)(padding.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"",(allocator *)((long)&type + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&type + 7));
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      ptVar7 = t_field::get_type(*pptVar8);
      ptStack_128 = (t_base_type *)t_generator::get_true_type(ptVar7);
      uVar4 = (*(ptStack_128->super_t_type).super_t_doc._vptr_t_doc[5])();
      if ((uVar4 & 1) == 0) {
        uVar4 = (*(ptStack_128->super_t_type).super_t_doc._vptr_t_doc[10])();
        if ((((uVar4 & 1) == 0) &&
            (uVar4 = (*(ptStack_128->super_t_type).super_t_doc._vptr_t_doc[0xf])(), (uVar4 & 1) == 0
            )) && (uVar4 = (*(ptStack_128->super_t_type).super_t_doc._vptr_t_doc[0x10])(),
                  (uVar4 & 1) == 0)) {
          uVar4 = (*(ptStack_128->super_t_type).super_t_doc._vptr_t_doc[0xb])();
          if (((uVar4 & 1) == 0) &&
             (uVar4 = (*(ptStack_128->super_t_type).super_t_doc._vptr_t_doc[0xc])(),
             (uVar4 & 1) == 0)) {
            uVar4 = (*(ptStack_128->super_t_type).super_t_doc._vptr_t_doc[0xe])();
            if ((uVar4 & 1) != 0) {
              std::__cxx11::string::operator=(local_118,"            ");
            }
          }
          else {
            std::__cxx11::string::operator=(local_118,"           ");
          }
        }
        else {
          std::__cxx11::string::operator=(local_118,"             ");
        }
      }
      else {
        local_12c = t_base_type::get_base(ptStack_128);
        if (local_12c == TYPE_STRING) {
LAB_00480855:
          std::__cxx11::string::operator=(local_118,"           ");
        }
        else if (local_12c - TYPE_BOOL < 2) {
          std::__cxx11::string::operator=(local_118,"            ");
        }
        else if (local_12c - TYPE_I16 < 3) {
          std::__cxx11::string::operator=(local_118,"             ");
        }
        else if (local_12c == TYPE_DOUBLE) goto LAB_00480855;
      }
      poVar6 = std::operator<<(out,local_118);
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
      maybe_escape_identifier(&local_150,this,psVar9);
      poVar6 = std::operator<<(poVar6,(string *)&local_150);
      poVar6 = std::operator<<(poVar6," = try ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      ptVar7 = t_field::get_type(*pptVar8);
      type_name_abi_cxx11_(&local_170,this,ptVar7,false,false);
      poVar6 = std::operator<<(poVar6,(string *)&local_170);
      poVar6 = std::operator<<(poVar6,".read(from: proto)");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string(local_118);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_70);
    }
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"case let (_, unknownType):  try proto.skip(type: unknownType)")
    ;
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"try proto.readFieldEnd()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"try proto.readStructEnd()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    bVar1 = struct_has_required_fields(this,tstruct);
    if (bVar1) {
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"// Required fields");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      local_178 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
      local_70._M_current = local_178;
      while( true ) {
        local_180._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_70,&local_180);
        if (!bVar1) break;
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_70);
        bVar1 = field_is_optional(this,*pptVar8);
        if (!bVar1) {
          poVar6 = t_generator::indent((t_generator *)this,out);
          poVar6 = std::operator<<(poVar6,"try proto.validateValue(");
          pptVar8 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_70);
          psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
          maybe_escape_identifier(&local_1a0,this,psVar9);
          poVar6 = std::operator<<(poVar6,(string *)&local_1a0);
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = std::operator<<(poVar6,"named: \"");
          pptVar8 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_70);
          psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
          poVar6 = std::operator<<(poVar6,(string *)psVar9);
          poVar6 = std::operator<<(poVar6,"\")");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1a0);
        }
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_70);
      }
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"return ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_00,iVar2));
    std::operator<<(poVar6,"(");
    local_1a8 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_70._M_current = local_1a8;
    while( true ) {
      local_1b0._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_70,&local_1b0);
      if (!bVar1) break;
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
      poVar6 = std::operator<<(out,(string *)psVar9);
      poVar6 = std::operator<<(poVar6,": ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_70);
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
      maybe_escape_identifier(&local_1d0,this,psVar9);
      std::operator<<(poVar6,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      p_Var10 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator++(&local_70);
      visibility_1.field_2._8_8_ =
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (p_Var10,(__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                  *)((long)&visibility_1.field_2 + 8));
      if (bVar1) {
        std::operator<<(out,", ");
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  else {
    pcVar5 = "public";
    if (is_private) {
      pcVar5 = "private";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,pcVar5,(allocator *)((long)&fields_1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&fields_1 + 7));
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,local_1f8);
    poVar6 = std::operator<<(poVar6,
                             " static func readValueFromProtocol(__proto: TProtocol) throws -> ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator<<(poVar6,(string *)CONCAT44(extraout_var_01,iVar2));
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"try __proto.readStructBegin()");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    f_iter_1._M_current = (t_field **)t_struct::get_members(tstruct);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_210);
    local_218 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter_1._M_current);
    local_210._M_current = local_218;
    while( true ) {
      cStack_220 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter_1._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_210,&stack0xfffffffffffffde0);
      if (!bVar1) break;
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_210);
      local_221 = field_is_optional(this,*pptVar8);
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"var ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_210);
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
      maybe_escape_identifier(&local_248,this,psVar9);
      poVar6 = std::operator<<(poVar6,(string *)&local_248);
      poVar6 = std::operator<<(poVar6," : ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_210);
      ptVar7 = t_field::get_type(*pptVar8);
      type_name_abi_cxx11_(&local_268,this,ptVar7,(bool)(local_221 & 1),(bool)(~local_221 & 1));
      poVar6 = std::operator<<(poVar6,(string *)&local_268);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_248);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_210);
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar6,"fields: while true");
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"let (_, fieldType, fieldID) = try __proto.readFieldBegin()");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar6,"switch (fieldID, fieldType)");
    block_open(this,out);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"case (_, .STOP):");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"break fields");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    local_270 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter_1._M_current);
    local_210._M_current = local_270;
    while( true ) {
      local_278._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter_1._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_210,&local_278);
      if (!bVar1) break;
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"case (");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_210);
      iVar3 = t_field::get_key(*pptVar8);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6,", ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_210);
      ptVar7 = t_field::get_type(*pptVar8);
      type_to_enum_abi_cxx11_(&local_298,this,ptVar7,false);
      poVar6 = std::operator<<(poVar6,(string *)&local_298);
      poVar6 = std::operator<<(poVar6,"):");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_298);
      t_generator::indent_up((t_generator *)this);
      poVar6 = t_generator::indent((t_generator *)this,out);
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_210);
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
      maybe_escape_identifier(&local_2b8,this,psVar9);
      poVar6 = std::operator<<(poVar6,(string *)&local_2b8);
      poVar6 = std::operator<<(poVar6," = try __proto.readValue() as ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_210);
      ptVar7 = t_field::get_type(*pptVar8);
      type_name_abi_cxx11_(&local_2d8,this,ptVar7,false,false);
      poVar6 = std::operator<<(poVar6,(string *)&local_2d8);
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b8);
      t_generator::indent_down((t_generator *)this);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_210);
    }
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"case let (_, unknownType):");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"try __proto.skipType(unknownType)");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"try __proto.readFieldEnd()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"try __proto.readStructEnd()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    bVar1 = struct_has_required_fields(this,tstruct);
    if (bVar1) {
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"// Required fields");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      local_2e0 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter_1._M_current);
      local_210._M_current = local_2e0;
      while( true ) {
        local_2e8._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter_1._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_210,&local_2e8);
        if (!bVar1) break;
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_210);
        bVar1 = field_is_optional(this,*pptVar8);
        if (!bVar1) {
          poVar6 = t_generator::indent((t_generator *)this,out);
          poVar6 = std::operator<<(poVar6,"try __proto.validateValue(");
          pptVar8 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_210);
          psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
          poVar6 = std::operator<<(poVar6,(string *)psVar9);
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = std::operator<<(poVar6,"named: \"");
          pptVar8 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_210);
          psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
          poVar6 = std::operator<<(poVar6,(string *)psVar9);
          poVar6 = std::operator<<(poVar6,"\")");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        }
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_210);
      }
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"return ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_02,iVar2));
    std::operator<<(poVar6,"(");
    local_2f0 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter_1._M_current);
    local_210._M_current = local_2f0;
    while( true ) {
      local_2f8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter_1._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_210,&local_2f8);
      if (!bVar1) break;
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_210);
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
      poVar6 = std::operator<<(out,(string *)psVar9);
      poVar6 = std::operator<<(poVar6,": ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_210);
      psVar9 = t_field::get_name_abi_cxx11_(*pptVar8);
      maybe_escape_identifier(&local_318,this,psVar9);
      std::operator<<(poVar6,(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      p_Var10 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator++(&local_210);
      local_320._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter_1._M_current);
      bVar1 = __gnu_cxx::operator!=(p_Var10,&local_320);
      if (bVar1) {
        std::operator<<(out,", ");
      }
    }
    std::__cxx11::string::~string(local_1f8);
  }
  poVar6 = std::operator<<(out,")");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_reader(ostream& out,
                                                     t_struct* tstruct,
                                                     bool is_private) {

  if (!gen_cocoa_) {
    /** Swift 3 case */
    string visibility = is_private ? "fileprivate" : "public";

    indent(out) << visibility << " static func read(from proto: TProtocol) throws -> "
               << tstruct->get_name();

    block_open(out);
    indent(out) << "_ = try proto.readStructBegin()" << endl;

    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      bool optional = field_is_optional(*f_iter);
      indent(out) << "var " << maybe_escape_identifier((*f_iter)->get_name()) << ": "
                  << type_name((*f_iter)->get_type(), optional, !optional) << endl;
    }

    out << endl;

    // Loop over reading in fields
    indent(out) << "fields: while true";
    block_open(out);
    out << endl;

    indent(out) << "let (_, fieldType, fieldID) = try proto.readFieldBegin()" << endl << endl;
    indent(out) << "switch (fieldID, fieldType)";
    block_open(out);
    indent(out) << "case (_, .stop):            break fields" << endl;


    // Generate deserialization code for known cases
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      indent(out) << "case (" << (*f_iter)->get_key() << ", " << type_to_enum((*f_iter)->get_type()) << "):";
      string padding = "";

      t_type* type = get_true_type((*f_iter)->get_type());
      if (type->is_base_type()) {
        t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
        switch (tbase) {
          case t_base_type::TYPE_STRING:
          case t_base_type::TYPE_DOUBLE:
            padding = "           ";
          break;

          case t_base_type::TYPE_BOOL:
          case t_base_type::TYPE_I8:
            padding = "            ";
          break;
          case t_base_type::TYPE_I16:
          case t_base_type::TYPE_I32:
          case t_base_type::TYPE_I64:
            padding = "             ";
          break;
          default: break;
        }
      } else if (type->is_enum() || type->is_set() || type->is_map()) {
        padding = "             ";
      } else if (type->is_struct() || type->is_xception()) {
        padding = "           ";
      } else if (type->is_list()) {
        padding = "            ";
      }

      out << padding << maybe_escape_identifier((*f_iter)->get_name()) << " = try "
          << type_name((*f_iter)->get_type(), false, false) << ".read(from: proto)" << endl;
    }

    indent(out) << "case let (_, unknownType):  try proto.skip(type: unknownType)" << endl;
    block_close(out);
    out << endl;

    // Read field end marker
    indent(out) << "try proto.readFieldEnd()" << endl;
    block_close(out);
    out << endl;
    indent(out) << "try proto.readStructEnd()" << endl;

    if (struct_has_required_fields(tstruct)) {
      // performs various checks (e.g. check that all required fields are set)
      indent(out) << "// Required fields" << endl;

      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if (field_is_optional(*f_iter)) {
          continue;
        }
        indent(out) << "try proto.validateValue(" << maybe_escape_identifier((*f_iter)->get_name()) << ", "
                    << "named: \"" << (*f_iter)->get_name() << "\")" << endl;
      }
    }

    out << endl;

    indent(out) << "return " << tstruct->get_name() << "(";
    for (f_iter = fields.begin(); f_iter != fields.end();) {
      out << (*f_iter)->get_name() << ": " << maybe_escape_identifier((*f_iter)->get_name());
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }

  } else {
    /** Legacy Swif2/Cocoa case */
    string visibility = is_private ? "private" : "public";

    indent(out) << visibility << " static func readValueFromProtocol(__proto: TProtocol) throws -> "
                << tstruct->get_name();

    block_open(out);
    out << endl;
    indent(out) << "try __proto.readStructBegin()" << endl << endl;

    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      bool optional = field_is_optional(*f_iter);
      indent(out) << "var " << maybe_escape_identifier((*f_iter)->get_name()) << " : "
                  << type_name((*f_iter)->get_type(), optional, !optional) << endl;
    }

    out << endl;

    // Loop over reading in fields
    indent(out) << "fields: while true";
    block_open(out);
    out << endl;

    indent(out) << "let (_, fieldType, fieldID) = try __proto.readFieldBegin()" << endl << endl;
    indent(out) << "switch (fieldID, fieldType)";

    block_open(out);

    indent(out) << "case (_, .STOP):" << endl;
    indent_up();
    indent(out) << "break fields" << endl << endl;
    indent_down();

    // Generate deserialization code for known cases
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {

      indent(out) << "case (" << (*f_iter)->get_key() << ", " << type_to_enum((*f_iter)->get_type()) << "):" << endl;
      indent_up();
      indent(out) << maybe_escape_identifier((*f_iter)->get_name()) << " = try __proto.readValue() as "
                  << type_name((*f_iter)->get_type()) << endl << endl;
      indent_down();

    }

    indent(out) << "case let (_, unknownType):" << endl;
    indent_up();
    indent(out) << "try __proto.skipType(unknownType)" << endl;
    indent_down();
    block_close(out);
    out << endl;

    // Read field end marker
    indent(out) << "try __proto.readFieldEnd()" << endl;

    block_close(out);
    out << endl;
    indent(out) << "try __proto.readStructEnd()" << endl;
    out << endl;

    if (struct_has_required_fields(tstruct)) {
      // performs various checks (e.g. check that all required fields are set)
      indent(out) << "// Required fields" << endl;

      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if (field_is_optional(*f_iter)) {
          continue;
        }
        indent(out) << "try __proto.validateValue(" << (*f_iter)->get_name() << ", "
                    << "named: \"" << (*f_iter)->get_name() << "\")" << endl;
      }
    }

    out << endl;

    indent(out) << "return " << tstruct->get_name() << "(";
    for (f_iter = fields.begin(); f_iter != fields.end();) {
      out << (*f_iter)->get_name() << ": " << maybe_escape_identifier((*f_iter)->get_name());
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }
  }
  out << ")" << endl;

  block_close(out);

  out << endl;
}